

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O0

void __thiscall ALCdevice::ProcessHrtf(ALCdevice *this,size_t SamplesToDo)

{
  uint uVar1;
  uint uVar2;
  undefined *puVar3;
  reference pvVar4;
  span<std::array<float,_1024UL>,_18446744073709551615UL> *span_;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> *this_00;
  pointer pDVar5;
  undefined8 in_RSI;
  array<unsigned_int,_16UL> *in_RDI;
  ALuint ridx;
  ALuint lidx;
  size_type in_stack_ffffffffffffffa8;
  undefined8 local_28;
  undefined8 local_20;
  
  pvVar4 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffa8);
  uVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffa8);
  puVar3 = (anonymous_namespace)::MixDirectHrtf;
  uVar2 = *pvVar4;
  span_ = (span<std::array<float,_1024UL>,_18446744073709551615UL> *)
          al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
                    ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)
                     (in_RDI[0x1b9]._M_elems + 6),(ulong)uVar1);
  this_00 = (span<const_std::array<float,_1024UL>,_18446744073709551615UL> *)
            al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
                      ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)
                       (in_RDI[0x1b9]._M_elems + 6),(ulong)uVar2);
  al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::
  span<std::array<float,_1024UL>,_18446744073709551615UL,_true,_true>(this_00,span_);
  pDVar5 = std::unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_>::get
                     ((unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_> *)in_RDI);
  (*(code *)puVar3)(span_,this_00,local_28,local_20,in_RDI[0x10d]._M_elems + 4,pDVar5,in_RSI);
  return;
}

Assistant:

void ALCdevice::ProcessHrtf(const size_t SamplesToDo)
{
    /* HRTF is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    MixDirectHrtf(RealOut.Buffer[lidx], RealOut.Buffer[ridx], Dry.Buffer, HrtfAccumData,
        mHrtfState.get(), SamplesToDo);
}